

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

int nonius::list_reporters(void)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  pointer prVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>
  *r;
  iterator __end1;
  iterator __begin1;
  reporter_registry *__range1;
  size_type width;
  anon_class_1_0_00000001_for__M_comp cmp;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
  *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  string local_78 [36];
  int local_54;
  reference local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
  local_40;
  reporter_registry *local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
  local_20;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
  local_18;
  long local_10;
  
  global_reporter_registry_abi_cxx11_();
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
       ::begin(in_stack_ffffffffffffff58);
  global_reporter_registry_abi_cxx11_();
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  local_18._M_cur =
       (__node_type *)
       std::
       max_element<std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,std::unique_ptr<nonius::reporter,std::default_delete<nonius::reporter>>>,false,true>,nonius::list_reporters()::_lambda(std::pair<std::__cxx11::string_const,std::unique_ptr<nonius::reporter,std::default_delete<nonius::reporter>>>&,std::pair<std::__cxx11::string_const,std::unique_ptr<nonius::reporter,std::default_delete<nonius::reporter>>>&)_1_>
                 (local_20._M_cur,local_28._M_cur);
  std::__detail::
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
                *)0x20a3eb);
  local_10 = std::__cxx11::string::size();
  local_10 = local_10 + 2;
  std::operator<<((ostream *)&std::cout,"Available reporters:\n");
  std::ostream::operator<<(&std::cout,std::left);
  local_38 = global_reporter_registry_abi_cxx11_();
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    local_50 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
                            *)0x20a46f);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"  ");
      local_54 = (int)std::setw((int)local_10);
      poVar3 = std::operator<<(poVar3,(_Setw)local_54);
      in_stack_ffffffffffffff60 = std::operator<<(poVar3,(string *)local_50);
      prVar4 = std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>::operator->
                         ((unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_> *)
                          0x20a4da);
      (*prVar4->_vptr_reporter[2])();
      poVar3 = std::operator<<(in_stack_ffffffffffffff60,local_78);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_78);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
                  *)in_stack_ffffffffffffff60);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  return 0;
}

Assistant:

inline int list_reporters() {
        using reporter_entry_ref = decltype(*global_reporter_registry().begin());
        auto cmp = [](reporter_entry_ref a, reporter_entry_ref b) { return a.first.size() < b.first.size(); };
        auto width = 2 + std::max_element(global_reporter_registry().begin(), global_reporter_registry().end(), cmp)->first.size();

        std::cout << "Available reporters:\n";
        std::cout << std::left;
        for(auto&& r : global_reporter_registry()) {
            if(!r.first.empty()) {
                std::cout << "  " << std::setw(width) << r.first << r.second->description() << "\n";
            }
        }
        std::cout << '\n';
        return 0;
    }